

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O1

PointType __thiscall Bezier<3,_2>::at(Bezier<3,_2> *this,double *t,int *derivative_order)

{
  double dVar1;
  int iVar2;
  Curve<3,_2> CVar3;
  long lVar4;
  uint uVar5;
  int *in_RCX;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  double in_XMM1_Qa;
  double dVar10;
  PointType PVar11;
  PointsType temp;
  double local_48 [7];
  double dStack_10;
  
  iVar2 = *in_RCX;
  lVar4 = (long)iVar2;
  if (lVar4 < 4) {
    dVar1 = *(double *)derivative_order;
    in_XMM1_Qa = t[lVar4 * 8 + 2];
    local_48[6] = t[lVar4 * 8 + 8];
    dStack_10 = (t + lVar4 * 8 + 8)[1];
    local_48[4] = t[lVar4 * 8 + 6];
    local_48[5] = (t + lVar4 * 8 + 6)[1];
    local_48[2] = t[lVar4 * 8 + 4];
    local_48[3] = (t + lVar4 * 8 + 4)[1];
    local_48[0] = in_XMM1_Qa;
    local_48[1] = (t + lVar4 * 8 + 2)[1];
    if (iVar2 != 3) {
      dVar10 = 1.0;
      if (dVar1 <= 1.0) {
        dVar10 = dVar1;
      }
      dVar10 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar10);
      uVar5 = 3 - iVar2;
      in_XMM1_Qa = 1.0 - dVar10;
      uVar6 = 1;
      if (1 < (int)uVar5) {
        uVar6 = (ulong)uVar5;
      }
      uVar8 = 0;
      do {
        if ((long)uVar8 < (long)(int)uVar5) {
          lVar9 = 0;
          pdVar7 = local_48;
          do {
            if (lVar9 == 3) {
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                            "Eigen::Block<Eigen::Matrix<double, 2, 4>, 2, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 2, 4>, BlockRows = 2, BlockCols = 1, InnerPanel = true]"
                           );
            }
            lVar9 = lVar9 + 1;
            *pdVar7 = pdVar7[2] * dVar10 + *pdVar7 * in_XMM1_Qa;
            pdVar7[1] = pdVar7[3] * dVar10 + pdVar7[1] * in_XMM1_Qa;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < (long)((long)(int)uVar5 - uVar8));
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar6);
    }
    dVar1 = (double)*(int *)((long)t + lVar4 * 4 + 0x110);
    local_48[0] = dVar1 * local_48[0];
    dVar1 = dVar1 * local_48[1];
    CVar3.length_._0_4_ = SUB84(dVar1,0);
    CVar3._vptr_Curve = (_func_int **)local_48[0];
    CVar3.length_._4_4_ = (int)((ulong)dVar1 >> 0x20);
    this->super_Curve<3,_2> = CVar3;
  }
  else {
    local_48[0] = 0.0;
    (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)0x0;
    (this->super_Curve<3,_2>).length_ = 0.0;
  }
  PVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  PVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       local_48[0];
  return (PointType)
         PVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

auto at(const double& t, const int& derivative_order = 0) const -> PointType override {
    double t_ = std::clamp(t, 0.0, 1.0);

    if (derivative_order > N) {
      return PointType::Zero();
    }

    /// De Casteljau’s Algorithm ///
    PointsType temp = derivative_precal_points_[derivative_order];

    int I_range = N - derivative_order;
    for (int i = 0; i < I_range; ++i) {
      int J_range = I_range - i;
      for (int j = 0; j < J_range; ++j) {
        {
          temp.col(j) = (1.0 - t_) * temp.col(j) + t_ * temp.col(j + 1);
        }
      }
    }
    return derivative_precal_prefix_[derivative_order] * temp.col(0);
  }